

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileScalarOperation::Finalize<int,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,int *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  TDigest *this_00;
  bool bVar1;
  reference pvVar2;
  Value input;
  
  if (state->pos != 0) {
    duckdb_tdigest::TDigest::process(state->h);
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    this_00 = state->h;
    pvVar2 = vector<float,_true>::operator[]((vector<float,_true> *)((this->bind_data).ptr + 1),0);
    input = duckdb_tdigest::TDigest::quantile(this_00,(double)*pvVar2);
    bVar1 = TryCast::Operation<double,int>(input,target,false);
    if (!bVar1) {
      *target = (input < 0.0) + 0x7fffffff;
    }
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.h);
		D_ASSERT(finalize_data.input.bind_data);
		state.h->compress();
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto source = state.h->quantile(bind_data.quantiles[0]);
		ApproxQuantileCoding::Decode(source, target);
	}